

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateTypeDefinition(ExpressionTranslateContext *ctx,TypeBase *type)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  TypeEnum *typeEnum;
  uint *puVar5;
  
  if ((type->hasTranslation == false) && (type->hasTranslation = true, type->isGeneric == false)) {
    switch(type->typeID) {
    case 0x13:
      TranslateTypeDefinition(ctx,(TypeBase *)type[1]._vptr_TypeBase);
      Print(ctx,"struct ");
      PrintEscapedName(ctx,type->name);
      PrintLine(ctx);
      PrintIndentedLine(ctx,"{");
      ctx->depth = ctx->depth + 1;
      PrintIndent(ctx);
      TranslateTypeName(ctx,(TypeBase *)type[1]._vptr_TypeBase);
      Print(ctx," ptr[%lld];",
            (ulong)(-(*(int *)(type[1]._vptr_TypeBase + 6) * (int)*(long *)&type[1].typeID) & 3) +
            *(long *)&type[1].typeID);
      PrintLine(ctx);
      PrintIndent(ctx);
      PrintEscapedName(ctx,type->name);
      Print(ctx,"& set(unsigned index, ");
      TranslateTypeName(ctx,(TypeBase *)type[1]._vptr_TypeBase);
      Print(ctx," const& val){ ptr[index] = val; return *this; }");
      PrintLine(ctx);
      PrintIndent(ctx);
      TranslateTypeName(ctx,(TypeBase *)type[1]._vptr_TypeBase);
      Print(ctx,
            "* index(unsigned i){ if(unsigned(i) < %u) return &ptr[i]; nullcThrowError(\"ERROR: array index out of bounds\"); return 0; }"
            ,(ulong)type[1].typeID);
      PrintLine(ctx);
      break;
    default:
      goto switchD_0014e6b3_caseD_14;
    case 0x15:
      Print(ctx,"struct __typeProxy_");
      PrintEscapedName(ctx,type->name);
      Print(ctx,"{};");
      PrintLine(ctx);
      return;
    case 0x18:
      if ((type->importModule != (ModuleData *)0x0) &&
         (*(char *)((long)&type[3]._vptr_TypeBase + 1) != '\0')) {
        return;
      }
      if (*(char *)&type[3]._vptr_TypeBase != '\x01') {
        return;
      }
      puVar5 = &type[1].typeID;
      puVar4 = puVar5;
      while (lVar1 = *(long *)puVar4, lVar1 != 0) {
        TranslateTypeDefinition(ctx,*(TypeBase **)(*(long *)(lVar1 + 8) + 0x20));
        puVar4 = (uint *)(lVar1 + 0x18);
      }
      Print(ctx,"struct ");
      PrintEscapedTypeName(ctx,type);
      PrintLine(ctx);
      PrintIndentedLine(ctx,"{");
      ctx->depth = ctx->depth + 1;
      uVar3 = 0;
      uVar2 = 0;
      while( true ) {
        lVar1 = *(long *)puVar5;
        if (lVar1 == 0) break;
        if (uVar2 < *(uint *)(*(long *)(lVar1 + 8) + 0x3c)) {
          PrintIndentedLine(ctx,"char pad_%d[%d];",uVar3);
        }
        PrintIndent(ctx);
        TranslateTypeName(ctx,*(TypeBase **)(*(long *)(lVar1 + 8) + 0x20));
        Print(ctx," ");
        TranslateVariableName(ctx,*(VariableData **)(lVar1 + 8));
        Print(ctx,";");
        PrintLine(ctx);
        uVar2 = *(int *)(*(long *)(lVar1 + 8) + 0x3c) +
                *(int *)(*(long *)(*(long *)(lVar1 + 8) + 0x20) + 0x30);
        uVar3 = (ulong)((int)uVar3 + 1);
        puVar5 = (uint *)(lVar1 + 0x18);
      }
      if (type->padding != 0) {
        PrintIndentedLine(ctx,"char pad_%d[%d];",uVar3);
      }
      break;
    case 0x19:
      Print(ctx,"struct ");
      PrintEscapedName(ctx,type->name);
      PrintLine(ctx);
      PrintIndentedLine(ctx,"{");
      ctx->depth = ctx->depth + 1;
      PrintIndent(ctx);
      PrintEscapedName(ctx,type->name);
      Print(ctx,"(): value(0){}");
      PrintLine(ctx);
      PrintIndent(ctx);
      PrintEscapedName(ctx,type->name);
      Print(ctx,"(int v): value(v){}");
      PrintLine(ctx);
      PrintIndentedLine(ctx,"int value;");
    }
    ctx->depth = ctx->depth - 1;
    PrintIndentedLine(ctx,"};");
    return;
  }
switchD_0014e6b3_caseD_14:
  return;
}

Assistant:

void TranslateTypeDefinition(ExpressionTranslateContext &ctx, TypeBase *type)
{
	if(type->hasTranslation)
		return;

	type->hasTranslation = true;

	if(type->isGeneric)
		return;

	if(TypeFunction *typeFunction = getType<TypeFunction>(type))
	{
		Print(ctx, "struct __typeProxy_");
		PrintEscapedName(ctx, typeFunction->name);
		Print(ctx, "{};");
		PrintLine(ctx);
	}
	else if(TypeArray *typeArray = getType<TypeArray>(type))
	{
		TranslateTypeDefinition(ctx, typeArray->subType);

		Print(ctx, "struct ");
		PrintEscapedName(ctx, typeArray->name);
		PrintLine(ctx);

		PrintIndentedLine(ctx, "{");
		ctx.depth++;

		PrintIndent(ctx);
		TranslateTypeName(ctx, typeArray->subType);
		Print(ctx, " ptr[%lld];", typeArray->length + ((4 - (typeArray->length * typeArray->subType->size % 4)) & 3)); // Round total byte size to 4
		PrintLine(ctx);

		PrintIndent(ctx);
		PrintEscapedName(ctx, typeArray->name);
		Print(ctx, "& set(unsigned index, ");
		TranslateTypeName(ctx, typeArray->subType);
		Print(ctx, " const& val){ ptr[index] = val; return *this; }");
		PrintLine(ctx);

		PrintIndent(ctx);
		TranslateTypeName(ctx, typeArray->subType);
		Print(ctx, "* index(unsigned i){ if(unsigned(i) < %u) return &ptr[i]; nullcThrowError(\"ERROR: array index out of bounds\"); return 0; }", (unsigned)typeArray->length);
		PrintLine(ctx);

		ctx.depth--;
		PrintIndentedLine(ctx, "};");
	}
	else if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		if(typeClass->importModule && typeClass->isInternal)
			return;

		if(!typeClass->completed)
			return;

		for(MemberHandle *curr = typeClass->members.head; curr; curr = curr->next)
			TranslateTypeDefinition(ctx, curr->variable->type);

		Print(ctx, "struct ");
		PrintEscapedTypeName(ctx, typeClass);
		PrintLine(ctx);

		PrintIndentedLine(ctx, "{");
		ctx.depth++;

		unsigned offset = 0;
		unsigned index = 0;

		for(MemberHandle *curr = typeClass->members.head; curr; curr = curr->next)
		{
			if(curr->variable->offset > offset)
				PrintIndentedLine(ctx, "char pad_%d[%d];", index, int(curr->variable->offset - offset));

			PrintIndent(ctx);

			TranslateTypeName(ctx, curr->variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, curr->variable);
			Print(ctx, ";");
			PrintLine(ctx);

			offset = unsigned(curr->variable->offset + curr->variable->type->size);
			index++;
		}

		if(typeClass->padding != 0)
			PrintIndentedLine(ctx, "char pad_%d[%d];", index, typeClass->padding);

		ctx.depth--;
		PrintIndentedLine(ctx, "};");
	}
	else if(TypeEnum *typeEnum = getType<TypeEnum>(type))
	{
		Print(ctx, "struct ");
		PrintEscapedName(ctx, typeEnum->name);
		PrintLine(ctx);

		PrintIndentedLine(ctx, "{");
		ctx.depth++;

		PrintIndent(ctx);
		PrintEscapedName(ctx, typeEnum->name);
		Print(ctx, "(): value(0){}");
		PrintLine(ctx);

		PrintIndent(ctx);
		PrintEscapedName(ctx, typeEnum->name);
		Print(ctx, "(int v): value(v){}");
		PrintLine(ctx);

		PrintIndentedLine(ctx, "int value;");

		ctx.depth--;
		PrintIndentedLine(ctx, "};");
	}
}